

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

expr_node * __thiscall expr_tree::sqrtDeriv(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  expr_node *peVar2;
  expr_node *denum;
  expr_node *deriv;
  expr_value local_50;
  expr_node *local_48;
  expr_value local_40;
  expr_value local_38 [3];
  expr_value local_20;
  expr_node *local_18;
  
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_20,4);
  expr_node::expr_node(peVar1,'\x05',&local_20);
  local_18 = peVar1;
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)local_38,1);
  expr_node::expr_node(peVar2,'\x01',local_38,local_18,(expr_node *)0x0,(expr_node *)0x0);
  local_18->left = peVar2;
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_40,3);
  expr_node::expr_node(peVar2,'\x05',&local_40,local_18,(expr_node *)0x0,(expr_node *)0x0);
  local_18->right = peVar2;
  local_48 = local_18->right;
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_50,2);
  expr_node::expr_node(peVar2,'\x01',&local_50);
  local_48->left = peVar2;
  peVar1 = Copy(peVar1);
  local_48->right = peVar1;
  Link(local_48,local_48->left,local_48->right);
  Link(local_18,local_18->left,local_18->right);
  return local_18;
}

Assistant:

expr_node* expr_tree::sqrtDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)DIV);
    deriv->left = new expr_node(INT, (long)1, deriv, nullptr, nullptr);
    deriv->right = new expr_node(OP, (long)MUL, deriv, nullptr, nullptr);
    expr_node* denum = deriv->right;
    denum->left = new expr_node(INT, (long)2);
    denum->right = Copy(node);
    Link(denum, denum->left, denum->right);
    Link(deriv, deriv->left, deriv->right);
    return deriv;
}